

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O2

uchar * Gia_AigerWriteMappingInt(Gia_Man_t *p,int *pMapSize)

{
  int iVar1;
  uint x;
  uchar *pPos;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iPrev;
  long lVar5;
  
  if (p->vMapping != (Vec_Int_t *)0x0) {
    iVar3 = 0;
    iVar4 = 1;
    while( true ) {
      iVar1 = p->nObjs;
      if (iVar1 <= iVar4) break;
      iVar1 = Gia_ObjIsLut(p,iVar4);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjLutSize(p,iVar4);
        iVar3 = iVar3 + iVar1 + 2;
      }
      iVar4 = iVar4 + 1;
    }
    pPos = (uchar *)malloc((long)iVar3 * 4 + 4);
    iVar4 = 4;
    iVar3 = 1;
    iPrev = 0;
    while( true ) {
      if (iVar1 <= iVar3) break;
      iVar1 = Gia_ObjIsLut(p,iVar3);
      if (iVar1 != 0) {
        x = Gia_ObjLutSize(p,iVar3);
        iVar4 = Gia_AigerWriteUnsignedBuffer(pPos,iVar4,x);
        lVar5 = 0;
        while( true ) {
          iVar1 = Gia_ObjLutSize(p,iVar3);
          if (iVar1 <= lVar5) break;
          piVar2 = Gia_ObjLutFanins(p,iVar3);
          iVar1 = piVar2[lVar5];
          iVar4 = Gia_AigerWriteDiffValue(pPos,iVar4,iPrev,iVar1);
          lVar5 = lVar5 + 1;
          iPrev = iVar1;
        }
        iVar4 = Gia_AigerWriteDiffValue(pPos,iVar4,iPrev,iVar3);
        iPrev = iVar3;
      }
      iVar3 = iVar3 + 1;
      iVar1 = p->nObjs;
    }
    Gia_AigerWriteInt(pPos,iVar4);
    *pMapSize = iVar4;
    return pPos;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                ,0xae,"unsigned char *Gia_AigerWriteMappingInt(Gia_Man_t *, int *)");
}

Assistant:

unsigned char * Gia_AigerWriteMappingInt( Gia_Man_t * p, int * pMapSize )
{
    unsigned char * pBuffer;
    int i, k, iPrev, iFan, nItems, iPos = 4;
    assert( Gia_ManHasMapping(p) );
    // count the number of entries to be written
    nItems = 0;
    Gia_ManForEachLut( p, i )
        nItems += 2 + Gia_ObjLutSize( p, i );
    pBuffer = ABC_ALLOC( unsigned char, sizeof(int) * (nItems + 1) );
    // write non-constant classes
    iPrev = 0;
    Gia_ManForEachLut( p, i )
    {
//printf( "\nSize = %d ", Gia_ObjLutSize(p, i) );
        iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Gia_ObjLutSize(p, i) );
        Gia_LutForEachFanin( p, i, iFan, k )
        {
//printf( "Fan = %d ", iFan );
            iPos = Gia_AigerWriteDiffValue( pBuffer, iPos, iPrev, iFan );
            iPrev = iFan;
        }
        iPos = Gia_AigerWriteDiffValue( pBuffer, iPos, iPrev, i );
        iPrev = i;
//printf( "Node = %d ", i );
    }
//printf( "\n" );
    Gia_AigerWriteInt( pBuffer, iPos );
    *pMapSize = iPos;
    return pBuffer;
}